

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageInputsXrGetVisibilityMaskKHR
                   (XrSession session,XrViewConfigurationType viewConfigurationType,
                   uint32_t viewIndex,XrVisibilityMaskTypeKHR visibilityMaskType,
                   XrVisibilityMaskKHR *visibilityMask)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  ValidateXrHandleResult VVar4;
  XrResult XVar5;
  char *pcVar6;
  long lVar7;
  GenValidUsageXrInstanceInfo *instance_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar8;
  string out;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  ostringstream oss;
  string local_2a8;
  string local_288;
  string local_268;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_248;
  XrSession local_228;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_248.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8[0]._M_dataplus._M_p._0_4_ = 2;
  local_228 = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &local_248,&local_228,(XrObjectType *)local_1a8);
  VVar4 = VerifyXrSessionHandle(&local_228);
  if (VVar4 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Invalid XrSession handle \"session\" ",0x23);
    local_288._M_dataplus._M_p = (pointer)local_228;
    paVar1 = &local_2a8.field_2;
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_2a8,'\x12');
    *local_2a8._M_dataplus._M_p = '0';
    local_2a8._M_dataplus._M_p[1] = 'x';
    pcVar6 = local_2a8._M_dataplus._M_p + (local_2a8._M_string_length - 1);
    lVar7 = 0;
    do {
      bVar2 = *(byte *)((long)&local_288._M_dataplus._M_p + lVar7);
      *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar7 = lVar7 + 1;
      pcVar6 = pcVar6 + -2;
    } while (lVar7 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"VUID-xrGetVisibilityMaskKHR-session-parameter","");
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_288,"xrGetVisibilityMaskKHR","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1c0,&local_248);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2a8,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_288,&local_1c0,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_1c0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    XVar5 = XR_ERROR_HANDLE_INVALID;
    goto LAB_0022f435;
  }
  pVar8 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,local_228);
  instance_info = pVar8.second;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"xrGetVisibilityMaskKHR","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"xrGetVisibilityMaskKHR","");
  paVar1 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"viewConfigurationType","");
  bVar3 = ValidateXrEnum(instance_info,local_1a8,&local_2a8,&local_288,&local_248,
                         viewConfigurationType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"xrGetVisibilityMaskKHR","")
    ;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"xrGetVisibilityMaskKHR","");
    local_288._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"visibilityMaskType","");
    bVar3 = ValidateXrEnum(instance_info,local_1a8,&local_2a8,&local_288,&local_248,
                           visibilityMaskType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Invalid XrVisibilityMaskTypeKHR \"visibilityMaskType\" enum value ",0x40);
      local_288._M_dataplus._M_p._0_4_ = visibilityMaskType;
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_2a8,'\n');
      *local_2a8._M_dataplus._M_p = '0';
      local_2a8._M_dataplus._M_p[1] = 'x';
      pcVar6 = local_2a8._M_dataplus._M_p + (local_2a8._M_string_length - 1);
      lVar7 = 0;
      do {
        bVar2 = *(byte *)((long)&local_288._M_dataplus._M_p + lVar7);
        *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
        pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
        lVar7 = lVar7 + 1;
        pcVar6 = pcVar6 + -2;
      } while (lVar7 != 4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"VUID-xrGetVisibilityMaskKHR-visibilityMaskType-parameter","")
      ;
      local_288._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,"xrGetVisibilityMaskKHR","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1f0,&local_248);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_288,
                          &local_1f0,&local_268);
      local_1d8.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_1f0.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1d8.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1f0.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        local_1d8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_1f0.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1d8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1f0.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      goto joined_r0x0022f246;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    if (visibilityMask == (XrVisibilityMaskKHR *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter","");
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"xrGetVisibilityMaskKHR","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_208,&local_248);
      local_288._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,
                 "Invalid NULL for XrVisibilityMaskKHR \"visibilityMask\" which is not optional and must be non-NULL"
                 ,"");
      CoreValidLogMessage(instance_info,local_1a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a8,
                          &local_208,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"xrGetVisibilityMaskKHR","");
      XVar5 = ValidateXrStruct(instance_info,local_1a8,&local_248,false,true,visibilityMask);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (XVar5 == XR_SUCCESS) {
        XVar5 = XR_SUCCESS;
        goto LAB_0022f435;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter","");
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"xrGetVisibilityMaskKHR","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_220,&local_248);
      local_288._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,
                 "Command xrGetVisibilityMaskKHR param visibilityMask is invalid","");
      CoreValidLogMessage(instance_info,local_1a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a8,
                          &local_220,&local_288);
      local_208.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_220.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_208.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_220.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        local_208.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_220.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_208.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_220.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
    }
    if (local_208.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ",0x43);
    local_288._M_dataplus._M_p._0_4_ = viewConfigurationType;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_2a8,'\n');
    *local_2a8._M_dataplus._M_p = '0';
    local_2a8._M_dataplus._M_p[1] = 'x';
    pcVar6 = local_2a8._M_dataplus._M_p + (local_2a8._M_string_length - 1);
    lVar7 = 0;
    do {
      bVar2 = *(byte *)((long)&local_288._M_dataplus._M_p + lVar7);
      *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar7 = lVar7 + 1;
      pcVar6 = pcVar6 + -2;
    } while (lVar7 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"VUID-xrGetVisibilityMaskKHR-viewConfigurationType-parameter",""
              );
    local_288._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_288,"xrGetVisibilityMaskKHR","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1d8,&local_248);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_288,
                        &local_1d8,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
joined_r0x0022f246:
    if (local_1d8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  XVar5 = XR_ERROR_VALIDATION_FAILURE;
LAB_0022f435:
  if (local_248.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return XVar5;
}

Assistant:

XrResult GenValidUsageInputsXrGetVisibilityMaskKHR(
XrSession session,
XrViewConfigurationType viewConfigurationType,
uint32_t viewIndex,
XrVisibilityMaskTypeKHR visibilityMaskType,
XrVisibilityMaskKHR* visibilityMask) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrGetVisibilityMaskKHR-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Make sure the enum type XrViewConfigurationType value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrGetVisibilityMaskKHR", "xrGetVisibilityMaskKHR", "viewConfigurationType", objects_info, viewConfigurationType)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(viewConfigurationType));
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-viewConfigurationType-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Make sure the enum type XrVisibilityMaskTypeKHR value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrGetVisibilityMaskKHR", "xrGetVisibilityMaskKHR", "visibilityMaskType", objects_info, visibilityMaskType)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrVisibilityMaskTypeKHR \"visibilityMaskType\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(visibilityMaskType));
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMaskType-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == visibilityMask) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR", objects_info,
                                "Invalid NULL for XrVisibilityMaskKHR \"visibilityMask\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrVisibilityMaskKHR is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetVisibilityMaskKHR", objects_info,
                                                        false, true, visibilityMask);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info,
                                "Command xrGetVisibilityMaskKHR param visibilityMask is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}